

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buf.c
# Opt level: O0

int xmlBufCCat(xmlBufPtr buf,char *str)

{
  xmlChar xVar1;
  size_t sVar2;
  int iVar3;
  xmlChar *local_28;
  char *cur;
  char *str_local;
  xmlBufPtr buf_local;
  
  if ((buf == (xmlBufPtr)0x0) || (buf->error != 0)) {
    buf_local._4_4_ = -1;
  }
  else {
    if ((buf->size != (ulong)buf->compat_size) && (buf->compat_size < 0x7fffffff)) {
      buf->size = (ulong)buf->compat_size;
    }
    if ((buf->use != (ulong)buf->compat_use) && (buf->compat_use < 0x7fffffff)) {
      buf->use = (ulong)buf->compat_use;
    }
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
      buf_local._4_4_ = -1;
    }
    else {
      local_28 = (xmlChar *)str;
      if (str == (char *)0x0) {
        buf_local._4_4_ = -1;
      }
      else {
        for (; *local_28 != '\0'; local_28 = local_28 + 1) {
          if ((buf->size <= buf->use + 10) && (iVar3 = xmlBufResize(buf,buf->use + 10), iVar3 == 0))
          {
            xmlBufMemoryError(buf,"growing buffer");
            return 2;
          }
          xVar1 = *local_28;
          sVar2 = buf->use;
          buf->use = sVar2 + 1;
          buf->content[sVar2] = xVar1;
        }
        buf->content[buf->use] = '\0';
        if (buf->size < 0x7fffffff) {
          buf->compat_size = (uint)buf->size;
        }
        else {
          buf->compat_size = 0x7fffffff;
        }
        if (buf->use < 0x7fffffff) {
          buf->compat_use = (uint)buf->use;
        }
        else {
          buf->compat_use = 0x7fffffff;
        }
        buf_local._4_4_ = 0;
      }
    }
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufCCat(xmlBufPtr buf, const char *str) {
    const char *cur;

    if ((buf == NULL) || (buf->error))
        return(-1);
    CHECK_COMPAT(buf)
    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return -1;
    if (str == NULL) {
#ifdef DEBUG_BUFFER
        xmlGenericError(xmlGenericErrorContext,
		"xmlBufCCat: str == NULL\n");
#endif
	return -1;
    }
    for (cur = str;*cur != 0;cur++) {
        if (buf->use  + 10 >= buf->size) {
            if (!xmlBufResize(buf, buf->use+10)){
		xmlBufMemoryError(buf, "growing buffer");
                return XML_ERR_NO_MEMORY;
            }
        }
        buf->content[buf->use++] = *cur;
    }
    buf->content[buf->use] = 0;
    UPDATE_COMPAT(buf)
    return 0;
}